

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianPreInt
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PointerType pdVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChElementHexaANCF_3843 *pCVar15;
  undefined8 *puVar16;
  ulong uVar17;
  char *pcVar18;
  undefined8 *puVar19;
  long lVar20;
  ulong uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  double *pdVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  Matrix<double,__1,__1,_0,__1,__1> K2;
  DstEvaluatorType dstEvaluator;
  ChMatrixNM<double,_1,_NSF> tempRow2;
  ChMatrixNM<double,_1,_NSF> tempRow1;
  ChMatrixNM<double,_1,_NSF> tempRow0;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  assign_op<double,_double> aStack_15aa1;
  long lStack_15aa0;
  long lStack_15a98;
  undefined8 *puStack_15a90;
  DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *pDStack_15a88;
  ChElementHexaANCF_3843 *pCStack_15a80;
  long lStack_15a78;
  double dStack_15a70;
  undefined8 uStack_15a68;
  DstEvaluatorType *pDStack_15a58;
  ChMatrixRef *pCStack_15a50;
  long lStack_15a48;
  ulong uStack_15a40;
  long lStack_15a38;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  gStack_15a30;
  plainobjectbase_evaluator_data<double,_32> pStack_15a08;
  undefined1 auStack_15a00 [64];
  undefined1 auStack_159c0 [64];
  undefined1 auStack_15980 [64];
  undefined1 auStack_15940 [64];
  undefined1 auStack_15900 [64];
  undefined1 auStack_158c0 [64];
  undefined1 auStack_15880 [64];
  undefined1 auStack_15840 [64];
  undefined1 auStack_15800 [64];
  undefined1 auStack_157c0 [64];
  undefined1 auStack_15780 [64];
  undefined1 auStack_15740 [64];
  undefined1 auStack_15700 [128];
  undefined1 auStack_15680 [64];
  undefined1 auStack_15640 [64];
  undefined1 auStack_15600 [64];
  undefined1 auStack_155c0 [64];
  undefined1 auStack_15580 [64];
  undefined1 auStack_15540 [64];
  undefined1 auStack_15500 [64];
  undefined1 auStack_154c0 [64];
  undefined1 auStack_15480 [64];
  undefined1 auStack_15440 [64];
  DstXprType DStack_15400;
  undefined1 auStack_13400 [64];
  undefined1 auStack_133c0 [64];
  undefined1 auStack_13380 [64];
  undefined1 auStack_13340 [64];
  undefined1 auStack_13300 [64];
  undefined1 auStack_132c0 [64];
  undefined1 auStack_13280 [64];
  undefined1 auStack_13240 [64];
  undefined1 auStack_13200 [64];
  undefined1 auStack_131c0 [64];
  undefined1 auStack_13180 [64];
  undefined1 auStack_13140 [64];
  SrcEvaluatorType SStack_13100;
  undefined1 auStack_130c0 [4160];
  ulong uStack_12080;
  Matrix3xN *pMStack_12078;
  undefined8 auStack_12070 [3];
  undefined8 auStack_12058 [3];
  undefined8 auStack_12040 [9218];
  
  pDStack_15a88 =
       (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
        *)Rfactor;
  dStack_15a70 = Kfactor;
  uStack_15a68 = in_XMM0_Qb;
  pDStack_15a58 = (DstEvaluatorType *)Mfactor;
  CalcCoordMatrix(this,(Matrix3xN *)auStack_15700);
  CalcCoordDerivMatrix(this,(Matrix3xN *)auStack_13400);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = this->m_Alpha;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = pDStack_15a88;
  auVar13._8_8_ = uStack_15a68;
  auVar13._0_8_ = dStack_15a70;
  puVar16 = auStack_12070;
  puVar22 = auStack_12040;
  lVar25 = 0;
  auVar35 = vfmadd213sd_fma(auVar52,auVar51,auVar13);
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[0] = this->m_Alpha * dStack_15a70;
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[1] = (double)auStack_13400;
  uStack_12080 = auVar35._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.
       m_data.array[0];
  auVar36 = vbroadcastsd_avx512f(auVar35);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_12080;
  auVar37 = vbroadcastsd_avx512f(auVar2);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13400);
  auVar39 = vmulpd_avx512f(auVar36,auStack_133c0);
  auVar40 = vmulpd_avx512f(auVar37,auStack_15700._0_64_);
  auVar41 = vmulpd_avx512f(auVar37,auStack_15700._64_64_);
  auVar42 = vmulpd_avx512f(auVar37,auStack_15680);
  auVar43 = vmulpd_avx512f(auVar37,auStack_15640);
  auVar44 = vmulpd_avx512f(auVar37,auStack_15600);
  auVar45 = vmulpd_avx512f(auVar37,auStack_155c0);
  auVar46 = vmulpd_avx512f(auVar37,auStack_15580);
  auVar47 = vmulpd_avx512f(auVar37,auStack_15540);
  auVar48 = vmulpd_avx512f(auVar37,auStack_15500);
  auVar49 = vmulpd_avx512f(auVar37,auStack_154c0);
  auVar50 = vmulpd_avx512f(auVar37,auStack_15480);
  auVar37 = vmulpd_avx512f(auVar37,auStack_15440);
  puVar19 = auStack_12058;
  auStack_15800 = vaddpd_avx512f(auVar40,auVar38);
  auStack_157c0 = vaddpd_avx512f(auVar41,auVar39);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13380);
  auStack_15780 = vaddpd_avx512f(auVar42,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13340);
  auStack_15740 = vaddpd_avx512f(auVar43,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13300);
  auStack_15900 = vaddpd_avx512f(auVar44,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_132c0);
  auStack_158c0 = vaddpd_avx512f(auVar45,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13280);
  auStack_15880 = vaddpd_avx512f(auVar46,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13240);
  auStack_15840 = vaddpd_avx512f(auVar47,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13200);
  auStack_15a00 = vaddpd_avx512f(auVar48,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_131c0);
  auStack_159c0 = vaddpd_avx512f(auVar49,auVar38);
  auVar38 = vmulpd_avx512f(auVar36,auStack_13180);
  auVar36 = vmulpd_avx512f(auVar36,auStack_13140);
  auStack_15980 = vaddpd_avx512f(auVar50,auVar38);
  auStack_15940 = vaddpd_avx512f(auVar37,auVar36);
  pMStack_12078 = (Matrix3xN *)auStack_15700;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(auStack_15700 + lVar25 * 8);
    auVar36 = vbroadcastsd_avx512f(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(auStack_15600 + lVar25 * 8);
    auVar37 = vbroadcastsd_avx512f(auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(auStack_15500 + lVar25 * 8);
    auVar38 = vbroadcastsd_avx512f(auVar5);
    lVar29 = 0;
    pdVar28 = (double *)&DStack_15400;
    do {
      auVar39 = *(undefined1 (*) [64])(auStack_15800 + lVar29 * 8);
      lVar29 = lVar29 + 8;
      auVar40 = vmulpd_avx512f(auVar36,auVar39);
      auVar41 = vmulpd_avx512f(auVar37,auVar39);
      auVar39 = vmulpd_avx512f(auVar38,auVar39);
      vpermt2pd_avx512f(_DAT_0099e580,auVar41);
      vpermt2pd_avx512f(_DAT_0099e600,auVar41);
      vpermt2pd_avx512f(_DAT_0099e680,auVar40);
      auVar40 = vpermt2pd_avx512f(_DAT_0099e5c0,auVar39);
      auVar41 = vpermt2pd_avx512f(_DAT_0099e640,auVar39);
      auVar39 = vpermt2pd_avx512f(_DAT_0099e6c0,auVar39);
      *(undefined1 (*) [64])(pdVar28 + 0x10) = auVar39;
      *(undefined1 (*) [64])(pdVar28 + 8) = auVar41;
      *(undefined1 (*) [64])pdVar28 = auVar40;
      pdVar28 = pdVar28 + 0x18;
    } while (lVar29 != 0x20);
    lVar29 = 0x10;
    puVar30 = puVar16;
    do {
      lVar33 = lVar29 + 0x30;
      uVar12 = *(undefined8 *)(auStack_15440 + lVar29 + 0x38);
      uVar1 = *(undefined8 *)
               ((long)DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
                      m_storage.m_data.array + lVar29);
      lVar29 = lVar29 + 0x18;
      puVar30[-2] = *(undefined8 *)(auStack_15440 + lVar33);
      puVar30[-1] = uVar12;
      *puVar30 = uVar1;
      puVar30 = puVar30 + 9;
    } while (lVar29 != 0x310);
    auVar36 = vbroadcastsd_avx512f(auVar36._0_16_);
    auVar37 = vbroadcastsd_avx512f(auVar37._0_16_);
    auVar38 = vbroadcastsd_avx512f(auVar38._0_16_);
    lVar29 = 0;
    pdVar28 = (double *)&DStack_15400;
    do {
      auVar39 = *(undefined1 (*) [64])(auStack_15900 + lVar29 * 8);
      lVar29 = lVar29 + 8;
      auVar40 = vmulpd_avx512f(auVar36,auVar39);
      auVar41 = vmulpd_avx512f(auVar37,auVar39);
      auVar39 = vmulpd_avx512f(auVar38,auVar39);
      vpermt2pd_avx512f(_DAT_0099e580,auVar41);
      vpermt2pd_avx512f(_DAT_0099e600,auVar41);
      vpermt2pd_avx512f(_DAT_0099e680,auVar40);
      auVar40 = vpermt2pd_avx512f(_DAT_0099e5c0,auVar39);
      auVar41 = vpermt2pd_avx512f(_DAT_0099e640,auVar39);
      auVar39 = vpermt2pd_avx512f(_DAT_0099e6c0,auVar39);
      *(undefined1 (*) [64])(pdVar28 + 0x10) = auVar39;
      *(undefined1 (*) [64])(pdVar28 + 8) = auVar41;
      *(undefined1 (*) [64])pdVar28 = auVar40;
      pdVar28 = pdVar28 + 0x18;
    } while (lVar29 != 0x20);
    lVar29 = 0x10;
    puVar30 = puVar19;
    do {
      lVar33 = lVar29 + 0x30;
      uVar12 = *(undefined8 *)(auStack_15440 + lVar29 + 0x38);
      uVar1 = *(undefined8 *)
               ((long)DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
                      m_storage.m_data.array + lVar29);
      lVar29 = lVar29 + 0x18;
      puVar30[-2] = *(undefined8 *)(auStack_15440 + lVar33);
      puVar30[-1] = uVar12;
      *puVar30 = uVar1;
      puVar30 = puVar30 + 9;
    } while (lVar29 != 0x310);
    lVar29 = 0;
    pdVar28 = (double *)&DStack_15400;
    do {
      auVar39 = *(undefined1 (*) [64])(auStack_15a00 + lVar29 * 8);
      lVar29 = lVar29 + 8;
      auVar40 = vmulpd_avx512f(auVar36,auVar39);
      auVar41 = vmulpd_avx512f(auVar37,auVar39);
      auVar39 = vmulpd_avx512f(auVar38,auVar39);
      vpermt2pd_avx512f(_DAT_0099e580,auVar41);
      vpermt2pd_avx512f(_DAT_0099e600,auVar41);
      vpermt2pd_avx512f(_DAT_0099e680,auVar40);
      auVar40 = vpermt2pd_avx512f(_DAT_0099e5c0,auVar39);
      auVar41 = vpermt2pd_avx512f(_DAT_0099e640,auVar39);
      auVar39 = vpermt2pd_avx512f(_DAT_0099e6c0,auVar39);
      *(undefined1 (*) [64])(pdVar28 + 0x10) = auVar39;
      *(undefined1 (*) [64])(pdVar28 + 8) = auVar41;
      *(undefined1 (*) [64])pdVar28 = auVar40;
      pdVar28 = pdVar28 + 0x18;
    } while (lVar29 != 0x20);
    lVar29 = 0x10;
    puVar30 = puVar22;
    do {
      lVar33 = lVar29 + 0x30;
      uVar12 = *(undefined8 *)(auStack_15440 + lVar29 + 0x38);
      uVar1 = *(undefined8 *)
               ((long)DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
                      m_storage.m_data.array + lVar29);
      lVar29 = lVar29 + 0x18;
      puVar30[-2] = *(undefined8 *)(auStack_15440 + lVar33);
      puVar30[-1] = uVar12;
      *puVar30 = uVar1;
      puVar30 = puVar30 + 9;
    } while (lVar29 != 0x310);
    lVar25 = lVar25 + 1;
    puVar16 = puVar16 + 0x120;
    puVar19 = puVar19 + 0x120;
    puVar22 = puVar22 + 0x120;
  } while (lVar25 != 0x20);
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[0] = (double)&uStack_12080;
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[2] = (double)&this->m_O2;
  pCStack_15a80 = this;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x400) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 1024, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 1024, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  pDStack_15a88 =
       (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
        *)&DStack_15400;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,1024,0,9,1024>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&lStack_15a48,pDStack_15a88);
  pCVar15 = pCStack_15a80;
  lVar29 = 0;
  puStack_15a90 = (undefined8 *)(lStack_15a48 + 0x40);
  lStack_15a78 = uStack_15a40 * 8;
  lStack_15a98 = 8;
  lStack_15aa0 = 0x10;
  lVar25 = 0;
  do {
    if ((long)uStack_15a40 < 3) {
LAB_006fa193:
      pcVar18 = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
      ;
LAB_006fa1bf:
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,pcVar18);
    }
    lVar33 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar7 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar8 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    lVar34 = lVar33 * lStack_15a98;
    lVar32 = lVar33 * lStack_15aa0;
    lVar33 = lVar33 * lVar29;
    lVar20 = 2;
    puVar16 = puStack_15a90;
    lVar31 = lVar25;
    do {
      if (lStack_15a38 <= lVar31) goto LAB_006fa193;
      if ((lVar8 < lVar25 * 3 + 3) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar20 + -2)) {
LAB_006fa1aa:
        pcVar18 = 
        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_006fa1bf;
      }
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar33 + -0x10) = puVar16[-8];
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar34 + -0x10) = puVar16[-7];
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar32 + -0x10) = puVar16[-6];
      if ((uStack_15a40 < 6) || (lStack_15a38 <= lVar31)) goto LAB_006fa193;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar20 + -1) goto LAB_006fa1aa;
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar33 + -8) = puVar16[-5];
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar34 + -8) = puVar16[-4];
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar32 + -8) = puVar16[-3];
      if ((uStack_15a40 < 9) || (lStack_15a38 <= lVar31)) goto LAB_006fa193;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar20) goto LAB_006fa1aa;
      lVar31 = lVar31 + 0x20;
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar33) = puVar16[-2];
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar34) = puVar16[-1];
      uVar1 = *puVar16;
      puVar16 = puVar16 + uStack_15a40 * 0x20;
      *(undefined8 *)((long)pdVar7 + lVar20 * 8 + lVar32) = uVar1;
      lVar20 = lVar20 + 3;
    } while (lVar20 != 0x62);
    lStack_15a98 = lStack_15a98 + 0x18;
    lStack_15aa0 = lStack_15aa0 + 0x18;
    lVar25 = lVar25 + 1;
    lVar29 = lVar29 + 0x18;
    puStack_15a90 = puStack_15a90 + uStack_15a40;
  } while (lVar25 != 0x20);
  uVar17 = (pCStack_15a80->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  uVar26 = (pCStack_15a80->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  if ((long)(uVar17 | uVar26) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((uVar26 != 0x20) || (uVar17 != 0x20)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 32, 32, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 32, 32, 1>]"
                 );
  }
  auVar14._8_8_ = uStack_15a68;
  auVar14._0_8_ = dStack_15a70;
  gStack_15a30.m_src = &SStack_13100;
  gStack_15a30.m_dstExpr = &DStack_15400;
  gStack_15a30.m_dst = (DstEvaluatorType *)&pStack_15a08;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar35 = vxorpd_avx512vl(auVar14,auVar11);
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .m_functor.m_other = auVar35._0_8_;
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (pCStack_15a80->m_K13Compact).
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  gStack_15a30.m_functor = &aStack_15aa1;
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride = 0x20;
  pStack_15a08.data = (double *)gStack_15a30.m_dstExpr;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
  ::run(&gStack_15a30);
  gStack_15a30.m_src = (SrcEvaluatorType *)&pCVar15->m_MassMatrix;
  uVar17 = 0xfffffffffffffff8;
  gStack_15a30.m_dst = pDStack_15a58;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pDStack_15a58;
  auVar36 = vbroadcastsd_avx512f(auVar6);
  do {
    auVar37 = vmulpd_avx512f(auVar36,*(undefined1 (*) [64])
                                      ((pCVar15->m_MassMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                                       .m_storage.m_data.array + uVar17 + 8));
    *(undefined1 (*) [64])(auStack_130c0 + uVar17 * 8) = auVar37;
    uVar17 = uVar17 + 8;
  } while (uVar17 < 0x208);
  uVar26 = 0;
  lVar25 = 0x10;
  lVar29 = -0xffffffc2;
  uVar17 = 0x2000000000;
  lVar33 = 8;
  lVar8 = 0;
  do {
    pCStack_15a80 = (ChElementHexaANCF_3843 *)lVar8;
    lStack_15aa0 = lVar33;
    dStack_15a70 = (double)uVar17;
    lStack_15a78 = lVar29;
    lStack_15a98 = lVar25;
    lVar25 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar7 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    puStack_15a90 = (undefined8 *)((ulong)dStack_15a70 >> 1 & 0x7fffffff);
    uVar17 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    uVar9 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    uVar21 = 0;
    iVar24 = 0x20;
    uVar23 = 2;
    do {
      if (uVar21 < uVar26) {
        uVar27 = (((int)uVar21 + -0x1f) * iVar24 + 0x3e0U >> 1) + (int)uVar26;
      }
      else {
        uVar27 = (int)puStack_15a90 + (int)uVar21;
      }
      pCStack_15a50 = H;
      if (0x20f < uVar27) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                     );
      }
      if (0x1f < (uVar21 | uVar26)) {
        pcVar18 = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 32, 32, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 32, 32, 1>, Level = 1]"
        ;
        goto LAB_006fa217;
      }
      if (((long)uVar17 <= (long)(uVar26 * 3)) || ((long)uVar9 <= (long)(uVar23 - 2))) {
LAB_006fa1c9:
        pcVar18 = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
        ;
LAB_006fa217:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,pcVar18);
      }
      dVar10 = *(double *)
                (&SStack_13100.
                  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                  .m_d.field_0x0 + (ulong)uVar27 * 8) + *(double *)(pDStack_15a88 + uVar21 * 8);
      *(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * (long)pCStack_15a80 + -0x10) =
           dVar10 + *(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * (long)pCStack_15a80 + -0x10);
      if ((uVar17 <= uVar26 * 3 + 1) ||
         (((uVar9 <= uVar23 - 1 ||
           (*(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * lStack_15aa0 + -8) =
                 dVar10 + *(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * lStack_15aa0 + -8),
           uVar17 <= uVar26 * 3 + 2)) || (uVar9 <= uVar23)))) goto LAB_006fa1c9;
      uVar21 = uVar21 + 1;
      iVar24 = iVar24 + -1;
      *(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * lStack_15a98) =
           dVar10 + *(double *)((long)pdVar7 + uVar23 * 8 + lVar25 * lStack_15a98);
      uVar23 = uVar23 + 3;
    } while (uVar23 != 0x62);
    pDStack_15a88 = pDStack_15a88 + 0x100;
    uVar26 = uVar26 + 1;
    lVar25 = lStack_15a98 + 0x18;
    lVar29 = lStack_15a78 + -2;
    uVar17 = (long)dStack_15a70 + lStack_15a78;
    lVar33 = lStack_15aa0 + 0x18;
    lVar8 = (long)pCStack_15a80 + 0x18;
    if (uVar26 == 0x20) {
      if (lStack_15a48 != 0) {
        free(*(void **)(lStack_15a48 + -8));
      }
      return;
    }
  } while( true );
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  For this method, the in-simulation calculations are
    // independent of the number of Gauss quadrature points used throughout the entire element.  Since computationally
    // expensive quantities are required for both the generalized internal force vector and its Jacobian, these values
    // were cached for reuse during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}